

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O3

size_t colamd_recommended(int nnz,int n_row,int n_col)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i_1;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  if ((n_row | nnz | n_col) < 0) {
    return 0;
  }
  uVar4 = (ulong)(uint)nnz;
  uVar8 = 1;
  uVar7 = 0;
  lVar1 = 0;
  do {
    while ((int)uVar8 == 0) {
      lVar1 = lVar1 + 1;
      uVar8 = 0;
      uVar7 = 0;
      if (lVar1 == 2) {
        uVar7 = 0;
        uVar8 = 0;
        uVar9 = 0;
        goto LAB_0011683b;
      }
    }
    uVar3 = uVar7 + uVar4;
    uVar6 = uVar7;
    if (uVar7 <= uVar4) {
      uVar6 = uVar4;
    }
    uVar7 = uVar3;
    if (uVar6 > uVar3) {
      uVar7 = 0;
    }
    uVar8 = (ulong)(uVar6 <= uVar3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 2);
  uVar9 = 0;
  if (uVar6 <= uVar3) {
    uVar9 = (ulong)(uint)n_col + 1;
  }
LAB_0011683b:
  uVar3 = (ulong)(uint)n_col;
  uVar6 = 0;
  lVar1 = 0;
  do {
    while ((int)uVar8 == 0) {
      lVar1 = lVar1 + 1;
      uVar8 = 0;
      uVar6 = 0;
      uVar2 = 0;
      uVar10 = 0;
      if (lVar1 == 0x18) goto LAB_001168b8;
    }
    uVar2 = uVar6 + uVar9;
    uVar10 = uVar6;
    if (uVar6 <= uVar9) {
      uVar10 = uVar9;
    }
    uVar6 = uVar2;
    if (uVar10 > uVar2) {
      uVar6 = 0;
    }
    uVar8 = (ulong)(uVar10 <= uVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x18);
  uVar8 = uVar6 >> 2;
  if (uVar2 < uVar10) {
    uVar2 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)(uint)n_row + 1;
    uVar2 = 1;
  }
LAB_001168b8:
  uVar6 = 0;
  lVar1 = 0;
  do {
    while ((int)uVar2 == 0) {
      lVar1 = lVar1 + 1;
      uVar2 = 0;
      uVar6 = 0;
      if (lVar1 == 0x10) {
        bVar11 = false;
LAB_0011693e:
        if (0x7ffffffe < uVar2) {
          uVar2 = 0;
        }
        if (!bVar11) {
          uVar2 = 0;
        }
        return uVar2;
      }
    }
    uVar9 = uVar6 + uVar10;
    uVar5 = uVar6;
    if (uVar6 <= uVar10) {
      uVar5 = uVar10;
    }
    uVar6 = uVar9;
    if (uVar5 > uVar9) {
      uVar6 = 0;
    }
    uVar2 = (ulong)(uVar5 <= uVar9);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  if (uVar5 <= uVar9) {
    uVar9 = uVar8 + uVar7;
    if (uVar8 < uVar7) {
      uVar8 = uVar7;
    }
    if (uVar8 <= uVar9) {
      uVar6 = uVar6 >> 2;
      uVar7 = uVar6 + uVar9;
      if (uVar6 < uVar9) {
        uVar6 = uVar9;
      }
      if (uVar6 <= uVar7) {
        uVar8 = uVar7 + uVar3;
        if (uVar3 < uVar7) {
          uVar3 = uVar7;
        }
        if (uVar3 <= uVar8) {
          uVar4 = uVar4 / 5;
          uVar7 = uVar4;
          if (uVar4 < uVar8) {
            uVar7 = uVar8;
          }
          bVar11 = uVar7 <= uVar8 + uVar4;
          uVar2 = 0;
          if (bVar11) {
            uVar2 = uVar8 + uVar4;
          }
          goto LAB_0011693e;
        }
      }
    }
  }
  bVar11 = false;
  uVar2 = 0;
  goto LAB_0011693e;
}

Assistant:

PUBLIC size_t COLAMD_recommended	/* returns recommended value of Alen. */
(
    /* === Parameters ======================================================= */

    Int nnz,			/* number of nonzeros in A */
    Int n_row,			/* number of rows in A */
    Int n_col			/* number of columns in A */
)
{
    size_t s, c, r ;
    int ok = TRUE ;
    if (nnz < 0 || n_row < 0 || n_col < 0)
    {
	return (0) ;
    }
    s = t_mult (nnz, 2, &ok) ;	    /* 2*nnz */
    c = COLAMD_C (n_col, &ok) ;	    /* size of column structures */
    r = COLAMD_R (n_row, &ok) ;	    /* size of row structures */
    s = t_add (s, c, &ok) ;
    s = t_add (s, r, &ok) ;
    s = t_add (s, n_col, &ok) ;	    /* elbow room */
    s = t_add (s, nnz/5, &ok) ;	    /* elbow room */
    ok = ok && (s < Int_MAX) ;
    return (ok ? s : 0) ;
}